

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::TileParameter::TileParameter(TileParameter *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__TileParameter_006fad30;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  if (this != (TileParameter *)&_TileParameter_default_instance_) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  this->tiles_ = 0;
  this->axis_ = 1;
  return;
}

Assistant:

TileParameter::TileParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.TileParameter)
}